

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AntennaLocation.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::AntennaLocation::Decode(AntennaLocation *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *stream_00;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  AntennaLocation *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x24) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  stream_00 = operator>>(local_18,&(this->m_AntennaLocation).super_DataTypeBase);
  operator>>(stream_00,&(this->m_RelativeAntennaLocation).super_DataTypeBase);
  return;
}

Assistant:

void AntennaLocation::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < ANTENNA_LOCATION_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> KDIS_STREAM m_AntennaLocation
           >> KDIS_STREAM m_RelativeAntennaLocation;
}